

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O0

int Nwk_ManMinimumBaseNode(Nwk_Obj_t *pObj,Vec_Int_t *vTruth,int fVerbose)

{
  Nwk_Man_t *p;
  Hop_Man_t *pHVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Hop_Obj_t *pHVar7;
  uint *pTruth_00;
  Nwk_Obj_t *pObj_00;
  bool bVar8;
  int local_54;
  int Counter;
  int k;
  int nSuppSize;
  int uSupp;
  Nwk_Man_t *pNtk;
  Nwk_Obj_t *pObjNew;
  Nwk_Obj_t *pFanin;
  uint *pTruth;
  int fVerbose_local;
  Vec_Int_t *vTruth_local;
  Nwk_Obj_t *pObj_local;
  
  p = pObj->pMan;
  pHVar1 = p->pManHop;
  pHVar7 = Hop_Regular(pObj->pFunc);
  iVar2 = Nwk_ObjFaninNum(pObj);
  pTruth_00 = Hop_ManConvertAigToTruth(pHVar1,pHVar7,iVar2,vTruth,0);
  iVar2 = Nwk_ObjFaninNum(pObj);
  iVar2 = Kit_TruthSupportSize(pTruth_00,iVar2);
  iVar3 = Nwk_ObjFaninNum(pObj);
  if (iVar2 == iVar3) {
    pObj_local._4_4_ = 0;
  }
  else {
    iVar3 = Nwk_ObjFaninNum(pObj);
    uVar4 = Kit_TruthSupport(pTruth_00,iVar3);
    iVar3 = Nwk_ObjFanoutNum(pObj);
    pObj_00 = Nwk_ManCreateNode(p,iVar2,iVar3);
    local_54 = 0;
    while( true ) {
      bVar8 = false;
      if (local_54 < pObj->nFanins) {
        pObjNew = pObj->pFanio[local_54];
        bVar8 = pObjNew != (Nwk_Obj_t *)0x0;
      }
      if (!bVar8) break;
      if ((uVar4 & 1 << ((byte)local_54 & 0x1f)) != 0) {
        Nwk_ObjAddFanin(pObj_00,pObjNew);
      }
      local_54 = local_54 + 1;
    }
    pHVar1 = p->pManHop;
    pHVar7 = pObj->pFunc;
    iVar2 = Nwk_ObjFaninNum(pObj);
    pHVar7 = Hop_Remap(pHVar1,pHVar7,uVar4,iVar2);
    pObj_00->pFunc = pHVar7;
    if (fVerbose != 0) {
      uVar4 = pObj->Id;
      uVar5 = Nwk_ObjFaninNum(pObj);
      uVar6 = Nwk_ObjFaninNum(pObj_00);
      printf("Reducing node %d fanins from %d to %d.\n",(ulong)uVar4,(ulong)uVar5,(ulong)uVar6);
    }
    Nwk_ObjReplace(pObj,pObj_00);
    pObj_local._4_4_ = 1;
  }
  return pObj_local._4_4_;
}

Assistant:

int Nwk_ManMinimumBaseNode( Nwk_Obj_t * pObj, Vec_Int_t * vTruth, int fVerbose )
{
    unsigned * pTruth;
    Nwk_Obj_t * pFanin, * pObjNew;
    Nwk_Man_t * pNtk = pObj->pMan;
    int uSupp, nSuppSize, k, Counter = 0;
    pTruth = Hop_ManConvertAigToTruth( pNtk->pManHop, Hop_Regular(pObj->pFunc), Nwk_ObjFaninNum(pObj), vTruth, 0 );
    nSuppSize = Kit_TruthSupportSize(pTruth, Nwk_ObjFaninNum(pObj));
    if ( nSuppSize == Nwk_ObjFaninNum(pObj) )
        return 0;
    Counter++;
    uSupp = Kit_TruthSupport( pTruth, Nwk_ObjFaninNum(pObj) );
    // create new node with the given support
    pObjNew = Nwk_ManCreateNode( pNtk, nSuppSize, Nwk_ObjFanoutNum(pObj) );
    Nwk_ObjForEachFanin( pObj, pFanin, k )
        if ( uSupp & (1 << k) )
            Nwk_ObjAddFanin( pObjNew, pFanin );
    pObjNew->pFunc = Hop_Remap( pNtk->pManHop, pObj->pFunc, uSupp, Nwk_ObjFaninNum(pObj) );
    if ( fVerbose )
        printf( "Reducing node %d fanins from %d to %d.\n", 
            pObj->Id, Nwk_ObjFaninNum(pObj), Nwk_ObjFaninNum(pObjNew) );
    Nwk_ObjReplace( pObj, pObjNew );
    return 1;
}